

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

void __thiscall
pybind11::detail::EigenConformable<false>::EigenConformable
          (EigenConformable<false> *this,EigenIndex r,EigenIndex c,EigenIndex rstride,
          EigenIndex cstride)

{
  Stride<_1,__1> local_20;
  
  this->conformable = true;
  this->rows = r;
  this->cols = c;
  (this->stride).m_outer.m_value = 0;
  (this->stride).m_inner.m_value = 0;
  this->negativestrides = false;
  if ((cstride | rstride) < 0) {
    this->negativestrides = true;
  }
  else {
    Eigen::Stride<-1,_-1>::Stride(&local_20,cstride,rstride);
    (this->stride).m_outer.m_value = local_20.m_outer.m_value;
    (this->stride).m_inner.m_value = local_20.m_inner.m_value;
  }
  return;
}

Assistant:

EigenConformable(EigenIndex r, EigenIndex c,
            EigenIndex rstride, EigenIndex cstride) :
        conformable{true}, rows{r}, cols{c} {
        // TODO: when Eigen bug #747 is fixed, remove the tests for non-negativity. http://eigen.tuxfamily.org/bz/show_bug.cgi?id=747
        if (rstride < 0 || cstride < 0) {
            negativestrides = true;
        } else {
            stride = {EigenRowMajor ? rstride : cstride /* outer stride */,
                      EigenRowMajor ? cstride : rstride /* inner stride */ };
        }
    }